

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O3

Variant * Jinx::Impl::GetKey(Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  Script *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Variant *this_01;
  CollectionItrPair local_28;
  
  this = (Script *)(script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  this_01 = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (this_01->m_type == CollectionItr) {
    Variant::GetCollectionItr(&local_28,this_01);
    Variant::Variant(__return_storage_ptr__,(Variant *)(local_28.first._M_node + 1));
    if (local_28.second.
        super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_28.second.
                 super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  else {
    Script::Error(this,"\'get key\' called with non-iterator param");
    __return_storage_ptr__->m_type = Null;
    Variant::SetNull(__return_storage_ptr__);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant GetKey(ScriptPtr script, const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		if (!params[0].IsCollectionItr())
		{
			s->Error("'get key' called with non-iterator param");
			return nullptr;
		}
		return params[0].GetCollectionItr().first->first;
	}